

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreeSearchPointPop(RtreeCursor *p)

{
  long lVar1;
  double dVar2;
  int iVar3;
  RtreeNode *pNode;
  RtreeSearchPoint *pRVar4;
  RtreeSearchPoint *pRVar5;
  sqlite3_int64 sVar6;
  u8 uVar7;
  u8 uVar8;
  undefined5 uVar9;
  int i;
  int iVar10;
  int j;
  long lVar11;
  int iVar12;
  
  lVar11 = 1 - (ulong)p->bPoint;
  pNode = *(RtreeNode **)((long)p + lVar11 * 8 + 0x58);
  if (pNode != (RtreeNode *)0x0) {
    nodeRelease((Rtree *)(p->base).pVtab,pNode);
    *(undefined8 *)((long)p + lVar11 * 8 + 0x58) = 0;
  }
  if (p->bPoint == '\0') {
    iVar3 = p->nPoint;
    lVar11 = (long)iVar3;
    if (lVar11 != 0) {
      pRVar4 = p->aPoint;
      p->anQueue[pRVar4->iLevel] = p->anQueue[pRVar4->iLevel] - 1;
      lVar1 = lVar11 + -1;
      iVar12 = (int)lVar1;
      p->nPoint = iVar12;
      pRVar5 = pRVar4 + lVar1;
      uVar7 = pRVar5->eWithin;
      uVar8 = pRVar5->iCell;
      uVar9 = *(undefined5 *)&pRVar5->field_0x13;
      pRVar4->iLevel = pRVar5->iLevel;
      pRVar4->eWithin = uVar7;
      pRVar4->iCell = uVar8;
      *(undefined5 *)&pRVar4->field_0x13 = uVar9;
      sVar6 = pRVar4[lVar1].id;
      pRVar4->rScore = pRVar4[lVar1].rScore;
      pRVar4->id = sVar6;
      if (iVar3 < 5) {
        p->aNode[1] = p->aNode[lVar11];
        p->aNode[lVar11] = (RtreeNode *)0x0;
      }
      if (2 < iVar3) {
        iVar10 = 0;
        iVar3 = 1;
        i = 0;
        do {
          j = iVar3;
          iVar10 = iVar10 + 2;
          if (iVar10 < iVar12) {
            pRVar5 = p->aPoint;
            pRVar4 = pRVar5 + iVar10;
            dVar2 = pRVar4->rScore;
            if ((pRVar5[j].rScore <= dVar2) &&
               ((pRVar5[j].rScore < dVar2 || (pRVar5[j].iLevel <= pRVar4->iLevel))))
            goto LAB_001e0a3d;
            j = iVar10;
            if (pRVar5[i].rScore <= dVar2) {
              if (pRVar5[i].rScore < dVar2) {
                return;
              }
              if (pRVar5[i].iLevel <= pRVar4->iLevel) {
                return;
              }
            }
          }
          else {
LAB_001e0a3d:
            pRVar4 = p->aPoint;
            if (pRVar4[i].rScore <= pRVar4[j].rScore) {
              if (pRVar4[i].rScore < pRVar4[j].rScore) {
                return;
              }
              if (pRVar4[i].iLevel <= pRVar4[j].iLevel) {
                return;
              }
            }
          }
          rtreeSearchPointSwap(p,i,j);
          iVar10 = j * 2;
          iVar3 = j * 2 + 1;
          i = j;
        } while (iVar3 < iVar12);
      }
    }
  }
  else {
    p->anQueue[(p->sPoint).iLevel] = p->anQueue[(p->sPoint).iLevel] - 1;
    p->bPoint = '\0';
  }
  return;
}

Assistant:

static void rtreeSearchPointPop(RtreeCursor *p){
  int i, j, k, n;
  i = 1 - p->bPoint;
  assert( i==0 || i==1 );
  if( p->aNode[i] ){
    nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
    p->aNode[i] = 0;
  }
  if( p->bPoint ){
    p->anQueue[p->sPoint.iLevel]--;
    p->bPoint = 0;
  }else if( p->nPoint ){
    p->anQueue[p->aPoint[0].iLevel]--;
    n = --p->nPoint;
    p->aPoint[0] = p->aPoint[n];
    if( n<RTREE_CACHE_SZ-1 ){
      p->aNode[1] = p->aNode[n+1];
      p->aNode[n+1] = 0;
    }
    i = 0;
    while( (j = i*2+1)<n ){
      k = j+1;
      if( k<n && rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[j])<0 ){
        if( rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, k);
          i = k;
        }else{
          break;
        }
      }else{
        if( rtreeSearchPointCompare(&p->aPoint[j], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, j);
          i = j;
        }else{
          break;
        }
      }
    }
  }
}